

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZTensor<TFad<6,_double>_>,_3>::TPZManVector
          (TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int64_t *piVar3;
  int64_t iVar4;
  TPZTensor<TFad<6,_double>_> *pTVar5;
  long lVar6;
  TPZTensor<TFad<6,_double>_> *pTVar7;
  ulong uVar8;
  
  lVar6 = 0;
  TPZVec<TPZTensor<TFad<6,_double>_>_>::TPZVec(&this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>,0);
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_016ad290;
  pTVar5 = this->fExtAlloc;
  pTVar7 = pTVar5;
  do {
    TPZTensor<TFad<6,_double>_>::TPZTensor(pTVar7);
    lVar6 = lVar6 + -0x1a8;
    pTVar7 = pTVar7 + 1;
  } while (lVar6 != -0x4f8);
  if (size < 4) {
    iVar4 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    uVar2 = SUB168(auVar1 * ZEXT816(0x1a8),0);
    uVar8 = uVar2 + 8;
    if (0xfffffffffffffff7 < uVar2) {
      uVar8 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x1a8),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    piVar3 = (int64_t *)operator_new__(uVar8);
    *piVar3 = size;
    pTVar5 = (TPZTensor<TFad<6,_double>_> *)(piVar3 + 1);
    lVar6 = 0;
    pTVar7 = pTVar5;
    do {
      TPZTensor<TFad<6,_double>_>::TPZTensor(pTVar7);
      lVar6 = lVar6 + -0x1a8;
      pTVar7 = pTVar7 + 1;
      iVar4 = size;
    } while (size * -0x1a8 - lVar6 != 0);
  }
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fStore = pTVar5;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNElements = size;
  (this->super_TPZVec<TPZTensor<TFad<6,_double>_>_>).fNAlloc = iVar4;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}